

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_alltoall_single(bsc_step_t depends,bsc_group_t group,void *src,void *dst,bsc_size_t size)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  bsc_pid_t dst_pid;
  ulong uVar4;
  
  if (group == (bsc_group_t)0x0) {
    uVar1 = bsp_nprocs();
  }
  else {
    uVar1 = *group;
  }
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if (group == (bsc_group_t)0x0) {
      iVar2 = bsp_pid();
      dst_pid = (bsc_pid_t)uVar4;
    }
    else {
      dst_pid = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + uVar4 * 4);
      iVar2 = *(int *)(*(long *)((long)group + 0x18) + uVar4 * 4);
    }
    bsc_put(depends,dst_pid,src,dst,iVar2 * size,size);
    src = (void *)((long)src + (long)size);
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_alltoall_single( bsc_step_t depends, bsc_group_t group,
                      const void * src, void * dst, bsc_size_t size )
{
    const group_t * g = group;
    bsp_pid_t i, P = g?g->size:bsp_nprocs() ;
    const char * src_bytes = (const char *) src;
    for ( i = 0; i < P; ++i ) {
        bsc_pid_t m = g?g->gid[i]:i;
        bsc_size_t doff = g?g->rof[i]:bsp_pid();
        bsc_put( depends, m, src_bytes + i * size, dst, doff * size, size );
    }
    return depends + 1;
}